

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internaltypes.cpp
# Opt level: O0

void __thiscall
libcellml::HistoryEpoch::HistoryEpoch
          (HistoryEpoch *this,ComponentConstPtr *component,string *sourceUrl,string *destinationUrl)

{
  element_type *this_00;
  shared_ptr<const_libcellml::ImportedEntity> local_70;
  shared_ptr<const_libcellml::ImportedEntity> local_60;
  allocator<char> local_49;
  shared_ptr<const_libcellml::ParentedEntity> local_48 [2];
  string *local_28;
  string *destinationUrl_local;
  string *sourceUrl_local;
  ComponentConstPtr *component_local;
  HistoryEpoch *this_local;
  
  local_28 = destinationUrl;
  destinationUrl_local = sourceUrl;
  sourceUrl_local = (string *)component;
  component_local = (ComponentConstPtr *)this;
  std::shared_ptr<libcellml::Model>::shared_ptr(&this->mDestinationModel,(nullptr_t)0x0);
  std::__cxx11::string::string((string *)&this->mDestinationUrl,(string *)local_28);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Component_const,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)local_48,
             (shared_ptr<const_libcellml::Component> *)sourceUrl_local);
  owningModel((libcellml *)&this->mSourceModel,(ParentedEntityConstPtr *)local_48);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(local_48);
  this_00 = std::
            __shared_ptr_access<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)sourceUrl_local);
  NamedEntity::name_abi_cxx11_(&this->mName,(NamedEntity *)this_00);
  std::__cxx11::string::string((string *)&this->mReferenceName);
  std::__cxx11::string::string((string *)&this->mSourceUrl,(string *)destinationUrl_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->mType,"component",&local_49);
  std::allocator<char>::~allocator(&local_49);
  std::shared_ptr<libcellml::ImportedEntity_const>::shared_ptr<libcellml::Component_const,void>
            ((shared_ptr<libcellml::ImportedEntity_const> *)&local_60,
             (shared_ptr<const_libcellml::Component> *)sourceUrl_local);
  setReferenceName(this,(ImportedEntityConstPtr *)&local_60);
  std::shared_ptr<const_libcellml::ImportedEntity>::~shared_ptr(&local_60);
  std::shared_ptr<libcellml::ImportedEntity_const>::shared_ptr<libcellml::Component_const,void>
            ((shared_ptr<libcellml::ImportedEntity_const> *)&local_70,
             (shared_ptr<const_libcellml::Component> *)sourceUrl_local);
  setDestinationModel(this,(ImportedEntityConstPtr *)&local_70);
  std::shared_ptr<const_libcellml::ImportedEntity>::~shared_ptr(&local_70);
  return;
}

Assistant:

HistoryEpoch::HistoryEpoch(const ComponentConstPtr &component, const std::string &sourceUrl, const std::string &destinationUrl)
    : mDestinationModel(nullptr)
    , mDestinationUrl(destinationUrl)
    , mSourceModel(owningModel(component))
    , mName(component->name())
    , mSourceUrl(sourceUrl)
    , mType("component")
{
    setReferenceName(component);
    setDestinationModel(component);
}